

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O2

void __thiscall Parameterization::PrintPlot3D(Parameterization *this,ofstream *outfile)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (**this->_vptr_Parameterization)();
  iVar3 = 0;
  while (this->G = iVar3, iVar3 < this->Gmax) {
    (*this->_vptr_Parameterization[5])(this);
    iVar3 = 0;
    while( true ) {
      this->L = iVar3;
      iVar1 = this->Lmax;
      if (iVar1 <= iVar3) break;
      iVar3 = 0;
      while (this->K = iVar3, iVar3 < this->Kmax) {
        uVar4 = 0;
        while( true ) {
          this->J = (int)uVar4;
          if (this->Jmax <= (int)uVar4) break;
          (*this->_vptr_Parameterization[2])
                    (this,uVar4,(ulong)(uint)this->K,(ulong)(uint)this->L,(ulong)(uint)this->G);
          poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
          std::operator<<(poVar2," ");
          uVar4 = (ulong)(this->J + 1);
        }
        iVar3 = this->K + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)outfile);
      iVar3 = this->L + 1;
    }
    iVar3 = 0;
    while (this->L = iVar3, iVar3 < iVar1) {
      iVar3 = 0;
      while (this->K = iVar3, iVar3 < this->Kmax) {
        uVar4 = 0;
        while( true ) {
          this->J = (int)uVar4;
          if (this->Jmax <= (int)uVar4) break;
          (*this->_vptr_Parameterization[3])
                    (this,uVar4,(ulong)(uint)this->K,(ulong)(uint)this->L,(ulong)(uint)this->G);
          poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
          std::operator<<(poVar2," ");
          uVar4 = (ulong)(this->J + 1);
        }
        iVar3 = this->K + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)outfile);
      iVar1 = this->Lmax;
      iVar3 = this->L + 1;
    }
    iVar3 = 0;
    while (this->L = iVar3, iVar3 < iVar1) {
      iVar3 = 0;
      while (this->K = iVar3, iVar3 < this->Kmax) {
        uVar4 = 0;
        while( true ) {
          this->J = (int)uVar4;
          if (this->Jmax <= (int)uVar4) break;
          (*this->_vptr_Parameterization[4])
                    (this,uVar4,(ulong)(uint)this->K,(ulong)(uint)this->L,(ulong)(uint)this->G);
          poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
          std::operator<<(poVar2," ");
          uVar4 = (ulong)(this->J + 1);
        }
        iVar3 = this->K + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)outfile);
      iVar1 = this->Lmax;
      iVar3 = this->L + 1;
    }
    iVar3 = this->G + 1;
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3D(ofstream& outfile) {

  PrintPlot3DHeader(outfile);

  for (G = 0; G < Gmax; G++) {

    setGridIndexRanges(G);

    // All x-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateX(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All y-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateY(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All z-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateZ(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

  }  //End: G for-loop
}